

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktUniformBlockTests.cpp
# Opt level: O3

void vkt::ubo::anon_unknown_0::createBlockBasicTypeCases
               (TestCaseGroup *group,TestContext *testCtx,string *name,VarType *type,
               deUint32 layoutFlags,int numInstances)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  TestNode *pTVar3;
  undefined4 in_register_0000008c;
  uint layoutFlags_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string local_70;
  deUint32 local_4c;
  TestNode *local_48;
  TestContext *local_40;
  undefined8 local_38;
  
  local_38 = CONCAT44(in_register_0000008c,numInstances);
  local_48 = &group->super_TestNode;
  local_40 = testCtx;
  pTVar3 = (TestNode *)operator_new(0x168);
  __str._M_dataplus._M_p = (pointer)&__str.field_2;
  pcVar2 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)&__str,pcVar2,pcVar2 + name->_M_string_length)
  ;
  std::__cxx11::string::append((char *)&__str);
  paVar1 = &local_70.field_2;
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
  local_4c = layoutFlags;
  BlockBasicTypeCase::BlockBasicTypeCase
            ((BlockBasicTypeCase *)pTVar3,local_40,&__str,&local_70,type,layoutFlags | 0x200,
             (int)local_38,LOAD_FULL_MATRIX);
  tcu::TestNode::addChild(local_48,pTVar3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__str._M_dataplus._M_p != &__str.field_2) {
    operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
  }
  pTVar3 = (TestNode *)operator_new(0x168);
  __str._M_dataplus._M_p = (pointer)&__str.field_2;
  pcVar2 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)&__str,pcVar2,pcVar2 + name->_M_string_length)
  ;
  std::__cxx11::string::append((char *)&__str);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
  layoutFlags_00 = local_4c | 0x400;
  BlockBasicTypeCase::BlockBasicTypeCase
            ((BlockBasicTypeCase *)pTVar3,local_40,&__str,&local_70,type,layoutFlags_00,
             (int)local_38,LOAD_FULL_MATRIX);
  tcu::TestNode::addChild(local_48,pTVar3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__str._M_dataplus._M_p != &__str.field_2) {
    operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
  }
  pTVar3 = (TestNode *)operator_new(0x168);
  __str._M_dataplus._M_p = (pointer)&__str.field_2;
  pcVar2 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)&__str,pcVar2,pcVar2 + name->_M_string_length)
  ;
  std::__cxx11::string::append((char *)&__str);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
  local_4c = local_4c | 0x600;
  BlockBasicTypeCase::BlockBasicTypeCase
            ((BlockBasicTypeCase *)pTVar3,local_40,&__str,&local_70,type,local_4c,(int)local_38,
             LOAD_FULL_MATRIX);
  tcu::TestNode::addChild(local_48,pTVar3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__str._M_dataplus._M_p != &__str.field_2) {
    operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
  }
  pTVar3 = (TestNode *)operator_new(0x168);
  __str._M_dataplus._M_p = (pointer)&__str.field_2;
  pcVar2 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)&__str,pcVar2,pcVar2 + name->_M_string_length)
  ;
  std::__cxx11::string::append((char *)&__str);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
  BlockBasicTypeCase::BlockBasicTypeCase
            ((BlockBasicTypeCase *)pTVar3,local_40,&__str,&local_70,type,layoutFlags | 0x200,
             (int)local_38,LOAD_MATRIX_COMPONENTS);
  tcu::TestNode::addChild(local_48,pTVar3);
  paVar1 = &local_70.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__str._M_dataplus._M_p != &__str.field_2) {
    operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
  }
  pTVar3 = (TestNode *)operator_new(0x168);
  __str._M_dataplus._M_p = (pointer)&__str.field_2;
  pcVar2 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)&__str,pcVar2,pcVar2 + name->_M_string_length)
  ;
  std::__cxx11::string::append((char *)&__str);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
  BlockBasicTypeCase::BlockBasicTypeCase
            ((BlockBasicTypeCase *)pTVar3,local_40,&__str,&local_70,type,layoutFlags_00,
             (int)local_38,LOAD_MATRIX_COMPONENTS);
  tcu::TestNode::addChild(local_48,pTVar3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__str._M_dataplus._M_p != &__str.field_2) {
    operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
  }
  pTVar3 = (TestNode *)operator_new(0x168);
  __str._M_dataplus._M_p = (pointer)&__str.field_2;
  pcVar2 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)&__str,pcVar2,pcVar2 + name->_M_string_length)
  ;
  std::__cxx11::string::append((char *)&__str);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
  BlockBasicTypeCase::BlockBasicTypeCase
            ((BlockBasicTypeCase *)pTVar3,local_40,&__str,&local_70,type,local_4c,(int)local_38,
             LOAD_MATRIX_COMPONENTS);
  tcu::TestNode::addChild(local_48,pTVar3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__str._M_dataplus._M_p != &__str.field_2) {
    operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

static void createBlockBasicTypeCases (tcu::TestCaseGroup* group, tcu::TestContext& testCtx, const std::string& name, const VarType& type, deUint32 layoutFlags, int numInstances = 0)
{
	group->addChild(new BlockBasicTypeCase(testCtx, name + "_vertex",			"", type, layoutFlags|DECLARE_VERTEX,						numInstances, LOAD_FULL_MATRIX));
	group->addChild(new BlockBasicTypeCase(testCtx, name + "_fragment",			"", type, layoutFlags|DECLARE_FRAGMENT,						numInstances, LOAD_FULL_MATRIX));
	group->addChild(new BlockBasicTypeCase(testCtx, name + "_both",				"",	type, layoutFlags|DECLARE_VERTEX|DECLARE_FRAGMENT,		numInstances, LOAD_FULL_MATRIX));
	group->addChild(new BlockBasicTypeCase(testCtx, name + "_vertex_comp_access",		"", type, layoutFlags|DECLARE_VERTEX,				numInstances, LOAD_MATRIX_COMPONENTS));
	group->addChild(new BlockBasicTypeCase(testCtx, name + "_fragment_comp_access",	"", type, layoutFlags|DECLARE_FRAGMENT,					numInstances, LOAD_MATRIX_COMPONENTS));
	group->addChild(new BlockBasicTypeCase(testCtx, name + "_both_comp_access",		"",	type, layoutFlags|DECLARE_VERTEX|DECLARE_FRAGMENT,	numInstances, LOAD_MATRIX_COMPONENTS));
}